

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

int GetFPS(void)

{
  float fVar1;
  long lVar2;
  double dVar3;
  float fVar4;
  
  fVar4 = (float)CORE.Time.frame;
  if (CORE.Time.frameCounter == 0) {
    GetFPS::average = 0.0;
    GetFPS::last = 0.0;
    GetFPS::index = 0;
    for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)GetFPS::history + lVar2) = 0;
    }
  }
  if ((fVar4 == 0.0) && (!NAN(fVar4))) {
    return 0;
  }
  dVar3 = glfwGetTime();
  if (0.01666666753590107 < dVar3 - (double)GetFPS::last) {
    dVar3 = glfwGetTime();
    GetFPS::last = (float)dVar3;
    GetFPS::index = (GetFPS::index + 1) % 0x1e;
    fVar1 = GetFPS::history[GetFPS::index];
    GetFPS::history[GetFPS::index] = fVar4 / 30.0;
    GetFPS::average = fVar4 / 30.0 + (GetFPS::average - fVar1);
  }
  fVar4 = roundf(1.0 / GetFPS::average);
  return (int)fVar4;
}

Assistant:

int GetFPS(void)
{
    int fps = 0;

#if !defined(SUPPORT_CUSTOM_FRAME_CONTROL)
    #define FPS_CAPTURE_FRAMES_COUNT    30      // 30 captures
    #define FPS_AVERAGE_TIME_SECONDS   0.5f     // 500 milliseconds
    #define FPS_STEP (FPS_AVERAGE_TIME_SECONDS/FPS_CAPTURE_FRAMES_COUNT)

    static int index = 0;
    static float history[FPS_CAPTURE_FRAMES_COUNT] = { 0 };
    static float average = 0, last = 0;
    float fpsFrame = GetFrameTime();

    // if we reset the window, reset the FPS info
    if (CORE.Time.frameCounter == 0)
    {
        average = 0;
        last = 0;
        index = 0;

        for (int i = 0; i < FPS_CAPTURE_FRAMES_COUNT; i++) history[i] = 0;
    }

    if (fpsFrame == 0) return 0;

    if ((GetTime() - last) > FPS_STEP)
    {
        last = (float)GetTime();
        index = (index + 1)%FPS_CAPTURE_FRAMES_COUNT;
        average -= history[index];
        history[index] = fpsFrame/FPS_CAPTURE_FRAMES_COUNT;
        average += history[index];
    }

    fps = (int)roundf(1.0f/average);
#endif

    return fps;
}